

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O1

string * __thiscall
trompeloeil::params_string<trompeloeil::wildcard,trompeloeil::wildcard>
          (string *__return_storage_ptr__,trompeloeil *this,
          tuple<trompeloeil::wildcard,_trompeloeil::wildcard> *t)

{
  ostringstream os;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  missed_value<trompeloeil::wildcard>((ostream *)local_190,0,(wildcard *)(this + 1));
  missed_value<trompeloeil::wildcard>((ostream *)local_190,1,(wildcard *)this);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string
  params_string(
    std::tuple<T...> const& t)
  {
    std::ostringstream os;
    stream_params(os, t);
    return os.str();
  }